

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O2

pair<std::complex<double>,_std::complex<double>_> *
Utils::SolveQuadratic
          (pair<std::complex<double>,_std::complex<double>_> *__return_storage_ptr__,double a,
          double b,double c)

{
  double extraout_XMM0_Qa;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  double dVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  double dVar6;
  double local_18 [2];
  
  local_18[0] = b * b + a * -4.0 * c;
  local_18[1] = 0.0;
  dVar3 = b;
  std::sqrt<double>((complex<double> *)local_18);
  dVar6 = a + a;
  auVar4._8_8_ = dVar3 + 0.0;
  auVar4._0_8_ = extraout_XMM0_Qa - b;
  auVar1._8_8_ = dVar6;
  auVar1._0_8_ = dVar6;
  auVar5 = divpd(auVar4,auVar1);
  *(undefined1 (*) [16])(__return_storage_ptr__->first)._M_value = auVar5;
  auVar2._0_8_ = -b - extraout_XMM0_Qa;
  auVar2._8_8_ = 0.0 - dVar3;
  auVar5._8_8_ = dVar6;
  auVar5._0_8_ = dVar6;
  auVar5 = divpd(auVar2,auVar5);
  *(undefined1 (*) [16])(__return_storage_ptr__->second)._M_value = auVar5;
  return __return_storage_ptr__;
}

Assistant:

std::pair<Complex, Complex> Utils::SolveQuadratic(double a, double b, double c)
{
    Complex D = std::sqrt(Complex(b * b - 4 * a * c));
    return {(Complex(-b) + D) / (2 * a), (Complex(-b) - D) / (2 * a)};
}